

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_LForward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  complex<double> *pcVar1;
  int64_t col;
  long lVar2;
  int64_t iVar3;
  complex<double> **ppcVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar5;
  undefined4 uVar6;
  complex<double> *BPtr;
  complex<double> *end_ki;
  complex<double> *elem_ki;
  complex<double> sum;
  int64_t j;
  int64_t k;
  int64_t dimension;
  complex<double> *in_stack_ffffffffffffff68;
  complex<double> *this_00;
  int64_t in_stack_ffffffffffffff88;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffff90;
  complex<double> *local_48;
  complex<double> local_40;
  complex<double> *local_30;
  long local_28;
  long local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  col = TPZBaseMatrix::Rows(in_RSI);
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  if ((col == lVar2) && (((char)in_RDI[3] == '\x04' || ((char)in_RDI[3] == '\x01')))) {
    local_20 = (**(code **)(*in_RDI + 0x60))();
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      local_30 = (complex<double> *)0x0;
      while( true ) {
        this_00 = local_30;
        iVar3 = TPZBaseMatrix::Cols(local_18);
        if (iVar3 <= (long)this_00) break;
        uVar5 = 0;
        uVar6 = 0;
        std::complex<double>::complex(&local_40,0.0,0.0);
        ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                            ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_28);
        local_48 = *ppcVar4;
        ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                            ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_28 + 1);
        pcVar1 = *ppcVar4;
        TPZFMatrix<std::complex<double>_>::operator()
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,col);
        while (local_48 = local_48 + 1, local_48 < pcVar1) {
          std::conj<double>(this_00);
          in_stack_ffffffffffffff88 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          in_stack_ffffffffffffff90 = (TPZFMatrix<std::complex<double>_> *)CONCAT44(uVar6,uVar5);
          std::operator*(in_stack_ffffffffffffff68,(complex<double> *)0x137e2c4);
          std::complex<double>::operator+=(this_00,in_stack_ffffffffffffff68);
        }
        TPZFMatrix<std::complex<double>_>::operator()
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,col);
        std::complex<double>::operator-=(this_00,in_stack_ffffffffffffff68);
        local_30 = (complex<double> *)(local_30->_M_value + 1);
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU) )
        return( 0 );
    
    int64_t dimension =this->Dim();
    for ( int64_t k = 0; k < dimension; k++ ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
        }
    }
    return( 1 );
}